

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexWriter.cpp
# Opt level: O3

bool __thiscall
Ptex::v2_2::PtexIncrWriter::writeConstantFace
          (PtexIncrWriter *this,int faceid,FaceInfo *f,void *data)

{
  bool bVar1;
  uint8_t edittype;
  uint32_t editsize;
  undefined1 local_39;
  int local_38;
  int local_34;
  FaceInfo local_30;
  undefined4 local_1c;
  
  local_39 = 0;
  local_30.res.ulog2 = '\0';
  local_30.res.vlog2 = '\0';
  local_30.adjedges = '\0';
  local_30.flags = '\0';
  local_30.adjfaces[0] = -1;
  local_30.adjfaces[1] = -1;
  local_30.adjfaces[2] = -1;
  local_30.adjfaces[3] = -1;
  local_1c = 0;
  local_38 = (this->super_PtexWriterBase)._pixelSize + 0x1c;
  local_34 = faceid;
  bVar1 = PtexWriterBase::storeFaceInfo(&this->super_PtexWriterBase,faceid,&local_30,f,1);
  if (bVar1) {
    PtexWriterBase::writeBlock(&this->super_PtexWriterBase,this->_fp,&local_39,1);
    PtexWriterBase::writeBlock(&this->super_PtexWriterBase,this->_fp,&local_38,4);
    PtexWriterBase::writeBlock(&this->super_PtexWriterBase,this->_fp,&local_34,0x1c);
    PtexWriterBase::writeBlock
              (&this->super_PtexWriterBase,this->_fp,data,(this->super_PtexWriterBase)._pixelSize);
  }
  return bVar1;
}

Assistant:

bool PtexIncrWriter::writeConstantFace(int faceid, const FaceInfo& f, const void* data)
{
    // init headers
    uint8_t edittype = et_editfacedata;
    uint32_t editsize;
    EditFaceDataHeader efdh;
    efdh.faceid = faceid;
    efdh.fdh.set(0, enc_constant);
    editsize = (uint32_t)sizeof(efdh) + _pixelSize;

    // check and store face info
    if (!storeFaceInfo(faceid, efdh.faceinfo, f, FaceInfo::flag_constant))
        return 0;

    // write headers
    writeBlock(_fp, &edittype, sizeof(edittype));
    writeBlock(_fp, &editsize, sizeof(editsize));
    writeBlock(_fp, &efdh, sizeof(efdh));
    // write data
    writeBlock(_fp, data, _pixelSize);
    return 1;
}